

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iep2_test.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  MPP_RET MVar2;
  undefined1 local_180 [4];
  int ch;
  iep2_test_cfg cfg;
  char **argv_local;
  int argc_local;
  
  cfg._352_8_ = argv;
  if (argc < 2) {
    iep2_test_help();
    argv_local._4_4_ = 0;
  }
  else {
    memset(local_180,0,0x168);
    cfg.w = 3;
    cfg.h = 0;
    cfg.src_fmt = 3;
    cfg.src_swa = 0;
    _opterr = 0;
    while (iVar1 = getopt(argc,(char **)cfg._352_8_,"i:w:h:c:o:C:v:f:"), iVar1 != -1) {
      switch(iVar1) {
      case 0x43:
        cfg.src_fmt = str_to_iep2_fmt(_optarg);
        cfg.src_swa = str_to_iep2_swa(_optarg);
        break;
      default:
        break;
      case 99:
        cfg.w = str_to_iep2_fmt(_optarg);
        cfg.h = str_to_iep2_swa(_optarg);
        break;
      case 0x66:
        iVar1 = strcmp(_optarg,"TFF");
        cfg.fp_slt._1_3_ = 0;
        cfg.fp_slt._0_1_ = iVar1 != 0;
        break;
      case 0x68:
        ch = atoi(_optarg);
        break;
      case 0x69:
        _mpp_log_l(4,"iep2_test","input filename: %s\n",0,_optarg);
        strncpy((char *)&cfg.dst_fmt,_optarg,99);
        cfg._320_8_ = fopen((char *)&cfg.dst_fmt,"rb");
        break;
      case 0x6f:
        _mpp_log_l(4,"iep2_test","output filename: %s\n",0,_optarg);
        strncpy(cfg.src_url + 0x5c,_optarg,99);
        cfg.fp_src = (FILE *)fopen(cfg.src_url + 0x5c,"w+b");
        break;
      case 0x76:
        _mpp_log_l(4,"iep2_test","verify file: %s\n",0,_optarg);
        strncpy(cfg.dst_url + 0x5c,_optarg,99);
        cfg.fp_dst = (FILE *)fopen(cfg.dst_url + 0x5c,"w+b");
        break;
      case 0x77:
        local_180 = (undefined1  [4])atoi(_optarg);
      }
    }
    MVar2 = check_input_cmd((iep2_test_cfg *)local_180);
    if (MVar2 == MPP_OK) {
      iep2_test((iep2_test_cfg *)local_180);
      if (cfg._320_8_ != 0) {
        fclose((FILE *)cfg._320_8_);
        cfg.slt_url[0x60] = '\0';
        cfg.slt_url[0x61] = '\0';
        cfg.slt_url[0x62] = '\0';
        cfg.slt_url[99] = '\0';
        cfg._324_4_ = 0;
      }
      if (cfg.fp_src != (FILE *)0x0) {
        fclose((FILE *)cfg.fp_src);
        cfg.fp_src = (FILE *)0x0;
      }
      if (cfg.fp_dst != (FILE *)0x0) {
        fclose((FILE *)cfg.fp_dst);
      }
      argv_local._4_4_ = 0;
    }
    else {
      _mpp_log_l(2,"iep2_test","failed to pass cmd line check\n",0);
      iep2_test_help();
      argv_local._4_4_ = -1;
    }
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char **argv)
{
    iep2_test_cfg cfg;
    int ch;

    if (argc < 2) {
        iep2_test_help();
        return 0;
    }

    memset(&cfg, 0, sizeof(cfg));
    cfg.src_fmt = IEP2_FMT_YUV420;
    cfg.src_swa = IEP2_YUV_SWAP_SP_UV;
    cfg.dst_fmt = IEP2_FMT_YUV420;
    cfg.dst_swa = IEP2_YUV_SWAP_SP_UV;

    /// get options
    opterr = 0;
    while ((ch = getopt(argc, argv, "i:w:h:c:o:C:v:f:")) != -1) {
        switch (ch) {
        case 'w': {
            cfg.w = atoi(optarg);
        } break;
        case 'h': {
            cfg.h = atoi(optarg);
        } break;
        case 'c': {
            cfg.src_fmt = str_to_iep2_fmt(optarg);
            cfg.src_swa = str_to_iep2_swa(optarg);
        } break;
        case 'C': {
            cfg.dst_fmt = str_to_iep2_fmt(optarg);
            cfg.dst_swa = str_to_iep2_swa(optarg);
        } break;
        case 'i': {
            mpp_log("input filename: %s\n", optarg);
            strncpy(cfg.src_url, optarg, sizeof(cfg.src_url) - 1);
            cfg.fp_src = fopen(cfg.src_url, "rb");
        } break;
        case 'o': {
            mpp_log("output filename: %s\n", optarg);
            strncpy(cfg.dst_url, optarg, sizeof(cfg.dst_url) - 1);
            cfg.fp_dst = fopen(cfg.dst_url, "w+b");
        } break;
        case 'v': {
            mpp_log("verify file: %s\n", optarg);
            strncpy(cfg.slt_url, optarg, sizeof(cfg.slt_url) - 1);
            cfg.fp_slt = fopen(cfg.slt_url, "w+b");
        } break;
        case 'f': {
            if (!strcmp(optarg, "TFF"))
                cfg.field_order = IEP2_FIELD_ORDER_TFF;
            else
                cfg.field_order = IEP2_FIELD_ORDER_BFF;
        } break;
        default: {
        } break;
        }
    }

    if (check_input_cmd(&cfg)) {
        mpp_err("failed to pass cmd line check\n");
        iep2_test_help();
        return -1;
    }

    iep2_test(&cfg);

    if (cfg.fp_src) {
        fclose(cfg.fp_src);
        cfg.fp_src = NULL;
    }

    if (cfg.fp_dst) {
        fclose(cfg.fp_dst);
        cfg.fp_dst = NULL;
    }

    if (cfg.fp_slt) {
        fclose(cfg.fp_slt);
        cfg.fp_slt = NULL;
    }

    return 0;
}